

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O0

uint32_t bswap32(uint32_t x)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  uint64_t t;
  uint32_t l;
  uint32_t h;
  uint32_t ml;
  uint32_t mh;
  uint32_t d;
  size_t i;
  uint32_t y;
  uint32_t x_local;
  
  y = x;
  for (i = 0; i < 2; i = i + 1) {
    cVar2 = (char)i;
    cVar1 = '\x03' - cVar2;
    uVar3 = 0xff << (cVar1 * '\b' & 0x1fU);
    uVar4 = 0xff << ((byte)((i & 0x1fffffff) << 3) & 0x1f);
    y = (x & uVar4) << ((cVar1 - cVar2) * '\b' & 0x1fU) |
        (x & uVar3) >> ((cVar1 - cVar2) * '\b' & 0x1fU) | y & ((uVar3 | uVar4) ^ 0xffffffff);
  }
  return y;
}

Assistant:

static inline uint32_t bswap32(const uint32_t x) {
  uint32_t y = x;
  size_t i;

  for (i = 0; i < sizeof(uint32_t) >> 1; i++) {

    uint32_t d = sizeof(uint32_t) - i - 1;

    uint32_t mh = ((uint32_t)0xff) << (d << 3);
    uint32_t ml = ((uint32_t)0xff) << (i << 3);

    uint32_t h = x & mh;
    uint32_t l = x & ml;

    uint64_t t = (l << ((d - i) << 3)) | (h >> ((d - i) << 3));

    y = t | (y & ~(mh | ml));
  }

  return y;
}